

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
          (PersistentStorageJson *this,DomainId *aId,string *aArrName)

{
  json *this_00;
  Status SVar1;
  reference pvVar2;
  reference this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itEnd;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_f0;
  iterator local_d0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  iterator local_90;
  iterator local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  this_00 = &this->mCache;
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_70,pvVar2);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_90,pvVar2);
  std::
  remove_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,ot::commissioner::persistent_storage::PersistentStorageJson::DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>(ot::commissioner::persistent_storage::DomainId_const&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::Domain_const&)_1_>
            (&local_50,&local_70,&local_90,(anon_class_8_1_ba1d30bc_for__M_pred)aId);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  local_b0.m_object = local_50.m_object;
  local_b0.m_it.object_iterator._M_node = local_50.m_it.object_iterator._M_node;
  local_b0.m_it.array_iterator._M_current = local_50.m_it.array_iterator._M_current;
  local_b0.m_it.primitive_iterator.m_it = local_50.m_it.primitive_iterator.m_it;
  this_01 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_d0,this_01);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  erase<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_0>
            (&local_f0,pvVar2,&local_b0,&local_d0);
  SVar1 = CacheToFile(this);
  return SVar1;
}

Assistant:

Status DelId(I const &aId, std::string aArrName)
    {
        auto itEnd = std::remove_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aId](const V &el) { return el.mId.mId == aId.mId; });
        mCache[aArrName].erase(itEnd, std::end(mCache[aArrName]));

        return CacheToFile();
    }